

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::pushStackFrame(VirtualMachine *this,Function *function)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *peVar2;
  undefined1 auStack_48 [8];
  Variable undefined;
  ulong local_30;
  size_t i;
  shared_ptr<runtime::StackFrame> newFrame;
  Function *function_local;
  VirtualMachine *this_local;
  
  newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)function;
  std::make_shared<runtime::StackFrame>();
  for (local_30 = 0;
      local_30 <
      *(ulong *)(*(long *)&newFrame.
                           super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi[2]._M_use_count + 8); local_30 = local_30 + 1) {
    undefined.type = Undefined;
    undefined._4_4_ = 0;
    auStack_48 = (undefined1  [8])0x0;
    peVar2 = std::__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&i);
    std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::push_back
              (&peVar2->locals,(value_type *)auStack_48);
  }
  peVar2 = std::__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&i);
  std::shared_ptr<runtime::StackFrame>::operator=(&peVar2->outer,&this->stackFrame);
  peVar2 = std::__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&i);
  _Var1 = newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  peVar2->programCounter = 0;
  peVar2 = std::__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&i);
  peVar2->function = (Function *)_Var1._M_pi;
  std::shared_ptr<runtime::StackFrame>::operator=
            (&this->stackFrame,(shared_ptr<runtime::StackFrame> *)&i);
  std::shared_ptr<runtime::StackFrame>::~shared_ptr((shared_ptr<runtime::StackFrame> *)&i);
  return;
}

Assistant:

void runtime::VirtualMachine::pushStackFrame(const runtime::Function* function) {
  auto newFrame = std::make_shared<StackFrame>();

  for (std::size_t i = 0; i < function->fn->localsCount; i++) {
    Variable undefined{};
    undefined.type = VariableType::Undefined;
    newFrame->locals.push_back(undefined);
  }

  newFrame->outer = this->stackFrame;
  newFrame->programCounter = 0;
  newFrame->function = function;

  this->stackFrame = newFrame;
}